

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  char flag;
  Message error;
  char buffer [256];
  char local_15e;
  byte local_15d;
  GTestLog local_15c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  void *local_150;
  long local_148;
  int local_13c;
  String local_138 [16];
  
LAB_0011c627:
  sVar4 = read(this->read_fd_,&local_15d,1);
  iVar3 = (int)sVar4;
  if (iVar3 == -1) goto code_r0x0011c640;
  if (iVar3 == 0) {
    this->outcome_ = DIED;
    goto LAB_0011c7a1;
  }
  if (iVar3 == 1) {
    if (local_15d < 0x52) {
      if (local_15d == 0x49) {
        iVar3 = this->read_fd_;
        Message::Message((Message *)&local_158);
        do {
          while( true ) {
            sVar4 = read(iVar3,local_138,0xff);
            uVar10 = (uint)sVar4;
            if ((int)uVar10 < 1) break;
            *(undefined1 *)((long)&local_138[0].c_str_ + (ulong)(uVar10 & 0x7fffffff)) = 0;
            poVar6 = (ostream *)(local_158.ptr_ + 0x10);
            if (local_158.ptr_ == (stringstream *)0x0) {
              poVar6 = (ostream *)0x0;
            }
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_138,sVar7);
          }
        } while ((uVar10 == 0xffffffff) && (piVar5 = __errno_location(), *piVar5 == 4));
        if (uVar10 == 0) {
          GTestLog::GTestLog(&local_15c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                             ,0x11d);
          StringStreamToString((internal *)&local_150,local_158.ptr_);
          pvVar1 = local_150;
          if (local_150 == (void *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
          }
          else if (local_148 != 0) {
            lVar8 = 0;
            do {
              if (*(char *)((long)pvVar1 + lVar8) == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
              }
              else {
                local_15e = *(char *)((long)pvVar1 + lVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,&local_15e,1);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != local_148);
          }
        }
        else {
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          GTestLog::GTestLog(&local_15c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                             ,0x120);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          local_13c = iVar3;
          GetLastErrnoDescription();
          pvVar1 = local_150;
          if (local_150 == (void *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
          }
          else if (local_148 != 0) {
            lVar8 = 0;
            do {
              if (*(char *)((long)pvVar1 + lVar8) == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
              }
              else {
                local_15e = *(char *)((long)pvVar1 + lVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,&local_15e,1);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != local_148);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_13c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if (local_150 != (void *)0x0) {
          operator_delete__(local_150);
        }
        GTestLog::~GTestLog(&local_15c);
        if (local_158.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)local_158.ptr_ + 8))();
          local_158.ptr_ = (stringstream *)0x0;
        }
      }
      else {
        if (local_15d != 0x4c) goto LAB_0011c804;
        this->outcome_ = LIVED;
      }
    }
    else if (local_15d == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_15d == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_0011c804:
      GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                         ,0x19e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_138);
    }
    goto LAB_0011c7a1;
  }
  goto LAB_0011c6b1;
code_r0x0011c640:
  piVar5 = __errno_location();
  if (*piVar5 != 4) goto LAB_0011c6b1;
  goto LAB_0011c627;
LAB_0011c6b1:
  GTestLog::GTestLog((GTestLog *)&local_150,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x1a3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription();
  pcVar2 = local_138[0].c_str_;
  if (local_138[0].c_str_ == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
  }
  else if (local_138[0].length_ != 0) {
    sVar9 = 0;
    do {
      if (pcVar2[sVar9] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
      }
      else {
        local_158.ptr_._0_1_ = pcVar2[sVar9];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)&local_158,1);
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != local_138[0].length_);
  }
  if (local_138[0].c_str_ != (char *)0x0) {
    operator_delete__(local_138[0].c_str_);
  }
  GTestLog::~GTestLog((GTestLog *)&local_150);
LAB_0011c7a1:
  do {
    iVar3 = close(this->read_fd_);
    if (iVar3 != -1) goto LAB_0011c7ea;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  String::Format((char *)local_138,"CHECK failed: File %s, line %d: %s != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x1a6,"posix::Close(read_fd())");
  DeathTestAbort(local_138);
LAB_0011c7ea:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}